

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_encoder.h
# Opt level: O3

bool __thiscall
draco::DynamicIntegerPointsKdTreeEncoder<1>::
EncodePoints<draco::PointDVector<unsigned_int>::PointDVectorIterator>
          (DynamicIntegerPointsKdTreeEncoder<1> *this,PointDVectorIterator begin,
          PointDVectorIterator end,uint32_t *bit_length,EncoderBuffer *buffer)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  
  this->bit_length_ = *bit_length;
  uVar2 = (int)end.item_ - (int)begin.item_;
  this->num_points_ = uVar2;
  if (buffer->bit_encoder_reserved_bytes_ < 1) {
    puVar1 = &this->num_points_;
    std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
              ((vector<char,std::allocator<char>> *)buffer,
               (buffer->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,this,puVar1);
    if (buffer->bit_encoder_reserved_bytes_ < 1) {
      std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                ((vector<char,std::allocator<char>> *)buffer,
                 (buffer->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish,puVar1,&this->dimension_);
    }
    uVar2 = *puVar1;
  }
  if (uVar2 != 0) {
    DirectBitEncoder::StartEncoding(&this->numbers_encoder_);
    DirectBitEncoder::StartEncoding(&this->remaining_bits_encoder_);
    DirectBitEncoder::StartEncoding(&this->axis_encoder_);
    DirectBitEncoder::StartEncoding(&this->half_encoder_);
    EncodeInternal<draco::PointDVector<unsigned_int>::PointDVectorIterator>(this,begin,end);
    DirectBitEncoder::EndEncoding(&this->numbers_encoder_,buffer);
    DirectBitEncoder::EndEncoding(&this->remaining_bits_encoder_,buffer);
    DirectBitEncoder::EndEncoding(&this->axis_encoder_,buffer);
    DirectBitEncoder::EndEncoding(&this->half_encoder_,buffer);
  }
  return true;
}

Assistant:

bool DynamicIntegerPointsKdTreeEncoder<compression_level_t>::EncodePoints(
    RandomAccessIteratorT begin, RandomAccessIteratorT end,
    const uint32_t &bit_length, EncoderBuffer *buffer) {
  bit_length_ = bit_length;
  num_points_ = static_cast<uint32_t>(end - begin);

  buffer->Encode(bit_length_);
  buffer->Encode(num_points_);
  if (num_points_ == 0) {
    return true;
  }

  numbers_encoder_.StartEncoding();
  remaining_bits_encoder_.StartEncoding();
  axis_encoder_.StartEncoding();
  half_encoder_.StartEncoding();

  EncodeInternal(begin, end);

  numbers_encoder_.EndEncoding(buffer);
  remaining_bits_encoder_.EndEncoding(buffer);
  axis_encoder_.EndEncoding(buffer);
  half_encoder_.EndEncoding(buffer);

  return true;
}